

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.hpp
# Opt level: O0

Uint64 __thiscall Diligent::CommandQueueVkImpl::GetNextFenceValue(CommandQueueVkImpl *this)

{
  CommandQueueVkImpl *this_local;
  memory_order __b;
  
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  return (this->m_NextFenceValue).super___atomic_base<unsigned_long>._M_i;
}

Assistant:

GetNextFenceValue() const override final { return m_NextFenceValue.load(); }